

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

void vera::addLabel(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                    *_func,Node *_node,LabelType _type,float _margin)

{
  Label *this;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_40;
  float local_20;
  LabelType local_1c;
  float _margin_local;
  LabelType _type_local;
  Node *_node_local;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *_func_local;
  
  local_20 = _margin;
  local_1c = _type;
  __margin_local = _node;
  _node_local = (Node *)_func;
  this = (Label *)operator_new(0xc0);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function(&local_40,_func);
  Label::Label(this,&local_40,__margin_local,local_1c,local_20);
  addLabel(this);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function(&local_40);
  return;
}

Assistant:

void addLabel(std::function<std::string(void)> _func, Node* _node, LabelType _type, float _margin) {
    addLabel( new vera::Label(_func, _node, _type, _margin) );
}